

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O2

void Gia_ManInseSimulateObj(Gia_Man_t *p,int Id)

{
  void *pvVar1;
  void *pvVar2;
  uint uVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Gia_Obj_t *pGVar9;
  void *pvVar10;
  word wVar11;
  void *pvVar12;
  long lVar13;
  void *pvVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  
  pGVar9 = Gia_ManObj(p,Id);
  uVar15 = *(ulong *)pGVar9;
  uVar5 = (uint)uVar15;
  if ((uVar15 & 0x1fffffff) == 0x1fffffff || (int)uVar5 < 0) {
    if ((int)uVar5 < 0 && (int)(uVar15 & 0x1fffffff) != 0x1fffffff) {
      pvVar4 = p->pData;
      uVar3 = p->iData;
      bVar18 = (uVar5 >> 0x1d & 1) == 0;
      pvVar10 = (void *)((long)pvVar4 + (long)(int)((Id - (uVar5 & 0x1fffffff)) * uVar3 * 2) * 8);
      pvVar1 = (void *)((long)pvVar10 + (long)(int)uVar3 * 8);
      pvVar12 = pvVar1;
      if (bVar18) {
        pvVar12 = pvVar10;
      }
      if (bVar18) {
        pvVar10 = pvVar1;
      }
      uVar15 = 0;
      uVar16 = 0;
      if (0 < (int)uVar3) {
        uVar16 = (ulong)uVar3;
      }
      for (; uVar16 != uVar15; uVar15 = uVar15 + 1) {
        *(undefined8 *)((long)pvVar4 + uVar15 * 8 + (long)(int)(Id * uVar3 * 2) * 8) =
             *(undefined8 *)((long)pvVar12 + uVar15 * 8);
        *(undefined8 *)
         ((long)pvVar4 + uVar15 * 8 + (long)(int)uVar3 * 8 + (long)(int)(Id * uVar3 * 2) * 8) =
             *(undefined8 *)((long)pvVar10 + uVar15 * 8);
      }
    }
    else if ((uVar5 & 0x9fffffff) == 0x9fffffff) {
      iVar6 = Gia_ObjCioId(pGVar9);
      if (p->vCis->nSize - p->nRegs <= iVar6) {
        if (((undefined1  [12])*pGVar9 & (undefined1  [12])0x9fffffff) ==
            (undefined1  [12])0x9fffffff) {
          iVar7 = Gia_ObjCioId(pGVar9);
          iVar6 = p->vCis->nSize;
          if (iVar6 - p->nRegs <= iVar7) {
            iVar7 = p->vCos->nSize;
            iVar8 = Gia_ObjCioId(pGVar9);
            pGVar9 = Gia_ManCo(p,(iVar7 - iVar6) + iVar8);
            iVar6 = Gia_ObjId(p,pGVar9);
            pvVar10 = p->pData;
            uVar5 = p->iData;
            uVar15 = 0;
            uVar16 = 0;
            if (0 < (int)uVar5) {
              uVar16 = (ulong)uVar5;
            }
            for (; uVar16 != uVar15; uVar15 = uVar15 + 1) {
              *(undefined8 *)((long)pvVar10 + uVar15 * 8 + (long)(int)(Id * uVar5 * 2) * 8) =
                   *(undefined8 *)((long)pvVar10 + uVar15 * 8 + (long)(int)(iVar6 * uVar5 * 2) * 8);
              *(undefined8 *)
               ((long)pvVar10 + uVar15 * 8 + (long)(int)uVar5 * 8 + (long)(int)(Id * uVar5 * 2) * 8)
                   = *(undefined8 *)
                      ((long)pvVar10 +
                      uVar15 * 8 + (long)(int)uVar5 * 8 + (long)(int)(iVar6 * uVar5 * 2) * 8);
            }
            return;
          }
        }
        __assert_fail("Gia_ObjIsRo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar15 = (ulong)p->iData;
      iVar6 = Id * p->iData;
      pvVar10 = p->pData;
      lVar13 = uVar15 * 8;
      for (lVar17 = 0; lVar17 < (int)uVar15; lVar17 = lVar17 + 1) {
        wVar11 = Gia_ManRandomW(0);
        *(word *)((long)pvVar10 + lVar17 * 8 + (long)(iVar6 * 2) * 8) = wVar11;
        *(word *)((long)pvVar10 + lVar17 * 8 + lVar13 + (long)(iVar6 * 2) * 8) = ~wVar11;
        uVar15 = (ulong)(uint)p->iData;
      }
    }
    else {
      if ((~uVar15 & 0x1fffffff1fffffff) != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcInse.c"
                      ,0x9f,"void Gia_ManInseSimulateObj(Gia_Man_t *, int)");
      }
      uVar5 = p->iData;
      pvVar10 = p->pData;
      uVar15 = 0;
      uVar16 = 0;
      if (0 < (int)uVar5) {
        uVar16 = (ulong)uVar5;
      }
      for (; uVar16 != uVar15; uVar15 = uVar15 + 1) {
        *(undefined8 *)((long)pvVar10 + uVar15 * 8 + (long)(int)(Id * uVar5 * 2) * 8) =
             0xffffffffffffffff;
        *(undefined8 *)
         ((long)pvVar10 + uVar15 * 8 + (long)(int)uVar5 * 8 + (long)(int)(Id * uVar5 * 2) * 8) = 0;
      }
    }
  }
  else {
    pvVar4 = p->pData;
    uVar3 = p->iData;
    lVar13 = (long)(int)uVar3;
    pvVar10 = (void *)((long)pvVar4 + (long)(int)((Id - (uVar5 & 0x1fffffff)) * uVar3 * 2) * 8);
    pvVar1 = (void *)((long)pvVar10 + lVar13 * 8);
    pvVar12 = pvVar10;
    if ((uVar5 >> 0x1d & 1) == 0) {
      pvVar12 = pvVar1;
      pvVar1 = pvVar10;
    }
    bVar18 = (uVar15 >> 0x3d & 1) == 0;
    pvVar10 = (void *)((long)pvVar4 +
                      (long)(int)((Id - ((uint)(uVar15 >> 0x20) & 0x1fffffff)) * uVar3 * 2) * 8);
    pvVar2 = (void *)((long)pvVar10 + lVar13 * 8);
    pvVar14 = pvVar2;
    if (bVar18) {
      pvVar14 = pvVar10;
    }
    if (bVar18) {
      pvVar10 = pvVar2;
    }
    uVar15 = 0;
    uVar16 = 0;
    if (0 < (int)uVar3) {
      uVar16 = (ulong)uVar3;
    }
    for (; uVar16 != uVar15; uVar15 = uVar15 + 1) {
      *(ulong *)((long)pvVar4 + uVar15 * 8 + (long)(int)(Id * uVar3 * 2) * 8) =
           *(ulong *)((long)pvVar14 + uVar15 * 8) | *(ulong *)((long)pvVar1 + uVar15 * 8);
      *(ulong *)((long)pvVar4 + uVar15 * 8 + lVar13 * 8 + (long)(int)(Id * uVar3 * 2) * 8) =
           *(ulong *)((long)pvVar10 + uVar15 * 8) & *(ulong *)((long)pvVar12 + uVar15 * 8);
    }
  }
  return;
}

Assistant:

void Gia_ManInseSimulateObj( Gia_Man_t * p, int Id )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, Id );
    word * pData0, * pDataA0, * pDataB0;
    word * pData1, * pDataA1, * pDataB1;
    int i;
    if ( Gia_ObjIsAnd(pObj) )
    {
        pData0  = Gia_ParTestObj( p, Id );
        pData1  = pData0 + p->iData;
        if ( Gia_ObjFaninC0(pObj) )
        {
            pDataA1 = Gia_ParTestObj( p, Gia_ObjFaninId0(pObj, Id) );
            pDataA0 = pDataA1 + p->iData;
            if ( Gia_ObjFaninC1(pObj) )
            {
                pDataB1 = Gia_ParTestObj( p, Gia_ObjFaninId1(pObj, Id) );
                pDataB0 = pDataB1 + p->iData;
            }
            else 
            {
                pDataB0 = Gia_ParTestObj( p, Gia_ObjFaninId1(pObj, Id) );
                pDataB1 = pDataB0 + p->iData;
            }
        }
        else 
        {
            pDataA0 = Gia_ParTestObj( p, Gia_ObjFaninId0(pObj, Id) );
            pDataA1 = pDataA0 + p->iData;
            if ( Gia_ObjFaninC1(pObj) )
            {
                pDataB1 = Gia_ParTestObj( p, Gia_ObjFaninId1(pObj, Id) );
                pDataB0 = pDataB1 + p->iData;
            }
            else 
            {
                pDataB0 = Gia_ParTestObj( p, Gia_ObjFaninId1(pObj, Id) );
                pDataB1 = pDataB0 + p->iData;
            }
        }
        for ( i = 0; i < p->iData; i++ )
            pData0[i] = pDataA0[i] | pDataB0[i], pData1[i] = pDataA1[i] & pDataB1[i];
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        pData0  = Gia_ParTestObj( p, Id );
        pData1  = pData0 + p->iData;
        if ( Gia_ObjFaninC0(pObj) )
        {
            pDataA1 = Gia_ParTestObj( p, Gia_ObjFaninId0(pObj, Id) );
            pDataA0 = pDataA1 + p->iData;
        }
        else 
        {
            pDataA0 = Gia_ParTestObj( p, Gia_ObjFaninId0(pObj, Id) );
            pDataA1 = pDataA0 + p->iData;
        }
        for ( i = 0; i < p->iData; i++ )
            pData0[i] = pDataA0[i], pData1[i] = pDataA1[i];
    }
    else if ( Gia_ObjIsCi(pObj) )
    {
        if ( Gia_ObjIsPi(p, pObj) )
        {
            pData0  = Gia_ParTestObj( p, Id );
            pData1  = pData0 + p->iData;
            for ( i = 0; i < p->iData; i++ )
                pData0[i] = Gia_ManRandomW(0), pData1[i] = ~pData0[i];
        }
        else
        {
            int Id2 = Gia_ObjId(p, Gia_ObjRoToRi(p, pObj));
            pData0  = Gia_ParTestObj( p, Id );
            pData1  = pData0 + p->iData;
            pDataA0 = Gia_ParTestObj( p, Id2 );
            pDataA1 = pDataA0 + p->iData;
            for ( i = 0; i < p->iData; i++ )
                pData0[i] = pDataA0[i], pData1[i] = pDataA1[i];
        }
    }
    else if ( Gia_ObjIsConst0(pObj) )
    {
        pData0  = Gia_ParTestObj( p, Id );
        pData1  = pData0 + p->iData;
        for ( i = 0; i < p->iData; i++ )
            pData0[i] = ~(word)0, pData1[i] = 0;
    }
    else assert( 0 );
}